

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::AddSnappedEdge
          (S2Builder *this,SiteId src,SiteId dst,InputEdgeIdSetId id,EdgeType edge_type,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids)

{
  pair<int,_int> local_3c;
  InputEdgeIdSetId local_34;
  
  local_3c.first = src;
  local_3c.second = dst;
  local_34 = id;
  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
  emplace_back<std::pair<int,int>>
            ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,&local_3c);
  std::vector<int,_std::allocator<int>_>::push_back(input_edge_ids,&local_34);
  if (edge_type == UNDIRECTED) {
    local_3c.first = dst;
    local_3c.second = src;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,&local_3c);
    local_3c.first = -0x80000000;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(input_edge_ids,&local_3c.first);
  }
  return;
}

Assistant:

inline void S2Builder::AddSnappedEdge(
    SiteId src, SiteId dst, InputEdgeIdSetId id, EdgeType edge_type,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids) const {
  edges->push_back(Edge(src, dst));
  input_edge_ids->push_back(id);
  if (edge_type == EdgeType::UNDIRECTED) {
    edges->push_back(Edge(dst, src));
    // Automatically created edges do not have input edge ids or labels.  This
    // can be used to distinguish the original direction of the undirected edge.
    input_edge_ids->push_back(IdSetLexicon::EmptySetId());
  }
}